

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::closeFile(Forth *this)

{
  uint uVar1;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  requireDStackDepth(this,1,"CLOSE-FILE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"CLOSE-FILE","");
  GetFileHandle((Forth *)&local_58,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::ios::clear((int)local_58 + (int)*(undefined8 *)(*local_58 + -0x18));
  std::fstream::close();
  ForthStack<unsigned_int>::setTop(&this->dStack,0);
  OpenFilesSqeeze(this);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void closeFile() {
	REQUIRE_DSTACK_DEPTH(1, "CLOSE-FILE");
	auto h = (dStack.getTop());
	auto f = GetFileHandle(h, "CLOSE-FILE", errorCloseFile);
	f->clear();
	f->close();
	dStack.setTop(0);
	OpenFilesSqeeze(); // squeeze OpenFile vector
}